

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper::RunImpl
          (acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper *this)

{
  undefined1 *this_00;
  FieldMap *this_01;
  Message *pMVar1;
  TestResults *pTVar2;
  char cVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  OrigSendingTime origSendingTime;
  SendingTime sendingTime;
  PossDupFlag possDupFlag;
  Message message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  undefined1 local_3b0 [16];
  _Alloc_hider _Stack_3a0;
  undefined1 local_350 [16];
  _Alloc_hider _Stack_340;
  TestDetails local_2f0;
  undefined1 local_2d0 [16];
  _Alloc_hider _Stack_2c0;
  undefined1 local_178 [344];
  
  pMVar1 = (Message *)(this->super_acceptorT11Fixture).super_sessionT11Fixture.object;
  createT11Logon((Logon *)local_178,"ISLD","TW",1);
  FIX::DateTime::nowUtc();
  local_3b0._8_8_ = local_2d0._8_8_;
  _Stack_3a0._M_p = _Stack_2c0._M_p;
  local_3b0._0_8_ = &PTR__DateTime_00326368;
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_178,SUB81(local_3b0,0));
  FIX::Message::~Message((Message *)local_178);
  createT1150ExecutionReport((ExecutionReport *)local_2d0,"ISLD","TW",2);
  FIX::Message::Message((Message *)local_178,(Message *)local_2d0);
  FIX::Message::~Message((Message *)local_2d0);
  cVar3 = FIX::Session::send((Message *)
                             (this->super_acceptorT11Fixture).super_sessionT11Fixture.object);
  if (cVar3 == '\0') {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar2 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)local_2d0,*ppTVar5,0x502);
    UnitTest::TestResults::OnTestFailure(pTVar2,(TestDetails *)local_2d0,"object->send( message )");
  }
  pMVar1 = (Message *)(this->super_acceptorT11Fixture).super_sessionT11Fixture.object;
  createT11ResendRequest((ResendRequest *)local_2d0,"ISLD","TW",3,2,2);
  FIX::DateTime::nowUtc();
  local_350._8_8_ = local_3b0._8_8_;
  _Stack_340._M_p = _Stack_3a0._M_p;
  local_350._0_8_ = &PTR__DateTime_00326368;
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_2d0,SUB81(local_350,0));
  FIX::Message::~Message((Message *)local_2d0);
  FIX::BoolField::BoolField((BoolField *)local_2d0,0x2b);
  local_2d0._0_8_ = &PTR__FieldBase_003289e0;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)local_3b0,0x7a,0);
  local_3b0._0_8_ = &PTR__FieldBase_00328a18;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)local_350,0x34,0);
  local_350._0_8_ = &PTR__FieldBase_00327840;
  this_00 = &(this->super_acceptorT11Fixture).super_sessionT11Fixture.super_TestCallback.field_0xe0;
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)local_2d0);
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)local_3b0);
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)local_350);
  this_01 = (FieldMap *)(local_178 + 0x70);
  FIX::FieldMap::setField(this_01,(FieldBase *)local_2d0,true);
  FIX::FieldMap::setField(this_01,(FieldBase *)local_3b0,true);
  FIX::FieldMap::setField(this_01,(FieldBase *)local_350,true);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar4;
  FIX::Message::toString_abi_cxx11_((int)&local_3f0,(int)local_178,8);
  FIX::Message::toString_abi_cxx11_((int)&local_3d0,(int)this + 0x70,8);
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2f0,*ppTVar5,0x50e);
  UnitTest::CheckEqual<std::__cxx11::string,std::__cxx11::string>
            (pTVar2,&local_3f0,&local_3d0,&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_350);
  FIX::FieldBase::~FieldBase((FieldBase *)local_3b0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_2d0);
  FIX::Message::~Message((Message *)local_178);
  return;
}

Assistant:

TEST_FIXTURE(acceptorT11Fixture, nextResendRequestT1150RepeatingGroup)
{
  object->next( createT11Logon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  FIX::Message message = createT1150ExecutionReport( "ISLD", "TW", 2 );
  CHECK( object->send( message ) );
  object->next( createT11ResendRequest( "ISLD", "TW", 3, 2, 2 ), UtcTimeStamp() );

  PossDupFlag possDupFlag;
  OrigSendingTime origSendingTime;
  SendingTime sendingTime;
  lastResent.getHeader().getField( possDupFlag );
  lastResent.getHeader().getField( origSendingTime );
  lastResent.getHeader().getField( sendingTime );
  message.getHeader().setField( possDupFlag );
  message.getHeader().setField( origSendingTime );
  message.getHeader().setField( sendingTime );
  CHECK_EQUAL( message.toString(), lastResent.toString() );
}